

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O0

int nghttp2_submit_origin
              (nghttp2_session *session,uint8_t flags,nghttp2_origin_entry *ov,size_t nov)

{
  nghttp2_mem *mem_00;
  uint8_t *puVar1;
  nghttp2_outbound_item *item_00;
  ulong uStack_70;
  int rv;
  size_t i;
  size_t len;
  nghttp2_origin_entry *ov_copy;
  nghttp2_ext_origin *origin;
  nghttp2_frame *frame;
  nghttp2_outbound_item *item;
  uint8_t *p;
  nghttp2_mem *mem;
  size_t nov_local;
  nghttp2_origin_entry *ov_local;
  uint8_t flags_local;
  nghttp2_session *session_local;
  
  i = 0;
  mem_00 = &session->mem;
  if (session->server == '\0') {
    return -0x207;
  }
  if (nov == 0) {
    len = 0;
  }
  else {
    for (uStack_70 = 0; uStack_70 < nov; uStack_70 = uStack_70 + 1) {
      i = ov[uStack_70].origin_len + i;
    }
    if (0x4000 < nov * 2 + i) {
      return -0x1f5;
    }
    len = (size_t)nghttp2_mem_malloc(mem_00,nov * 0x11 + i);
    if ((void *)len == (void *)0x0) {
      return -0x385;
    }
    item = (nghttp2_outbound_item *)(len + nov * 0x10);
    for (uStack_70 = 0; uStack_70 < nov; uStack_70 = uStack_70 + 1) {
      *(nghttp2_outbound_item **)(len + uStack_70 * 0x10) = item;
      *(size_t *)(len + uStack_70 * 0x10 + 8) = ov[uStack_70].origin_len;
      puVar1 = nghttp2_cpymem((uint8_t *)item,ov[uStack_70].origin,ov[uStack_70].origin_len);
      item = (nghttp2_outbound_item *)(puVar1 + 1);
      *puVar1 = '\0';
    }
    if ((long)item - len != nov * 0x11 + i) {
      __assert_fail("(size_t)(p - (uint8_t *)ov_copy) == nov * sizeof(nghttp2_origin_entry) + len + nov"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_submit.c"
                    ,0x278,
                    "int nghttp2_submit_origin(nghttp2_session *, uint8_t, const nghttp2_origin_entry *, size_t)"
                   );
    }
  }
  item_00 = (nghttp2_outbound_item *)nghttp2_mem_malloc(mem_00,0x98);
  if (item_00 == (nghttp2_outbound_item *)0x0) {
    free((void *)len);
    session_local._4_4_ = -0x385;
  }
  else {
    nghttp2_outbound_item_init(item_00);
    (item_00->aux_data).goaway.flags = '\x01';
    (item_00->frame).ext.payload = &item_00->ext_frame_payload;
    nghttp2_frame_origin_init((nghttp2_extension *)item_00,(nghttp2_origin_entry *)len,nov);
    session_local._4_4_ = nghttp2_session_add_item(session,item_00);
    if (session_local._4_4_ == 0) {
      session_local._4_4_ = 0;
    }
    else {
      nghttp2_frame_origin_free((nghttp2_extension *)item_00,mem_00);
      nghttp2_mem_free(mem_00,item_00);
    }
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_submit_origin(nghttp2_session *session, uint8_t flags,
                          const nghttp2_origin_entry *ov, size_t nov) {
  nghttp2_mem *mem;
  uint8_t *p;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_ext_origin *origin;
  nghttp2_origin_entry *ov_copy;
  size_t len = 0;
  size_t i;
  int rv;
  (void)flags;

  mem = &session->mem;

  if (!session->server) {
    return NGHTTP2_ERR_INVALID_STATE;
  }

  if (nov) {
    for (i = 0; i < nov; ++i) {
      len += ov[i].origin_len;
    }

    if (2 * nov + len > NGHTTP2_MAX_PAYLOADLEN) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    /* The last nov is added for terminal NULL character. */
    ov_copy =
        nghttp2_mem_malloc(mem, nov * sizeof(nghttp2_origin_entry) + len + nov);
    if (ov_copy == NULL) {
      return NGHTTP2_ERR_NOMEM;
    }

    p = (uint8_t *)ov_copy + nov * sizeof(nghttp2_origin_entry);

    for (i = 0; i < nov; ++i) {
      ov_copy[i].origin = p;
      ov_copy[i].origin_len = ov[i].origin_len;
      p = nghttp2_cpymem(p, ov[i].origin, ov[i].origin_len);
      *p++ = '\0';
    }

    assert((size_t)(p - (uint8_t *)ov_copy) ==
           nov * sizeof(nghttp2_origin_entry) + len + nov);
  } else {
    ov_copy = NULL;
  }

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    rv = NGHTTP2_ERR_NOMEM;
    goto fail_item_malloc;
  }

  nghttp2_outbound_item_init(item);

  item->aux_data.ext.builtin = 1;

  origin = &item->ext_frame_payload.origin;

  frame = &item->frame;
  frame->ext.payload = origin;

  nghttp2_frame_origin_init(&frame->ext, ov_copy, nov);

  rv = nghttp2_session_add_item(session, item);
  if (rv != 0) {
    nghttp2_frame_origin_free(&frame->ext, mem);
    nghttp2_mem_free(mem, item);

    return rv;
  }

  return 0;

fail_item_malloc:
  free(ov_copy);

  return rv;
}